

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnStatistics::ColumnStatistics(ColumnStatistics *this,BaseStatistics *stats_p)

{
  unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
  *this_00;
  PhysicalType PVar1;
  _Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  __ptr_00;
  _Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  this_01;
  pointer *__ptr;
  pointer __p;
  pointer *__ptr_1;
  DistinctStatistics *local_28;
  
  BaseStatistics::BaseStatistics(&this->stats,stats_p);
  (this->distinct_stats).
  super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
       (DistinctStatistics *)0x0;
  PVar1 = (this->stats).type.physical_type_;
  if (((0x1d < PVar1) || ((0x21800002U >> (PVar1 & 0x1f) & 1) == 0)) && (PVar1 != BIT)) {
    this_00 = &this->distinct_stats;
    this_01.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::DistinctStatistics_*,_false>)operator_new(0x18);
    DistinctStatistics::DistinctStatistics
              ((DistinctStatistics *)
               this_01.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl);
    local_28 = (DistinctStatistics *)0x0;
    __ptr_00.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
         .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>;
    (this_00->
    super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>).
    _M_t.
    super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
    .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false> =
         this_01.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl !=
        (DistinctStatistics *)0x0) {
      ::std::default_delete<duckdb::DistinctStatistics>::operator()
                ((default_delete<duckdb::DistinctStatistics> *)this_00,
                 (DistinctStatistics *)
                 __ptr_00.super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl);
    }
    if (local_28 != (DistinctStatistics *)0x0) {
      ::std::default_delete<duckdb::DistinctStatistics>::operator()
                ((default_delete<duckdb::DistinctStatistics> *)&local_28,local_28);
    }
  }
  return;
}

Assistant:

ColumnStatistics::ColumnStatistics(BaseStatistics stats_p) : stats(std::move(stats_p)) {
	if (DistinctStatistics::TypeIsSupported(stats.GetType())) {
		distinct_stats = make_uniq<DistinctStatistics>();
	}
}